

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cpp
# Opt level: O1

bool __thiscall
CommandLineArguments::SetOutputType(CommandLineArguments *this,int ac,char **av,int *i)

{
  bool bVar1;
  bool bVar2;
  OutputType OVar3;
  size_t sVar4;
  int ac_00;
  SimpleString outputType;
  SimpleString local_40;
  undefined1 local_38 [16];
  
  ac_00 = 0x1b19f4;
  SimpleString::SimpleString(&local_40,"-o");
  getParameterField((CommandLineArguments *)local_38,ac_00,(char **)(ulong)(uint)ac,(int *)av,
                    (SimpleString *)i);
  SimpleString::~SimpleString(&local_40);
  sVar4 = SimpleString::size((SimpleString *)local_38);
  if (sVar4 == 0) {
LAB_001aaf36:
    bVar2 = false;
  }
  else {
    SimpleString::SimpleString(&local_40,"normal");
    bVar1 = operator==((SimpleString *)local_38,&local_40);
    bVar2 = true;
    if (!bVar1) {
      SimpleString::SimpleString((SimpleString *)(local_38 + 8),"eclipse");
      bVar2 = operator==((SimpleString *)local_38,(SimpleString *)(local_38 + 8));
      SimpleString::~SimpleString((SimpleString *)(local_38 + 8));
    }
    SimpleString::~SimpleString(&local_40);
    OVar3 = OUTPUT_ECLIPSE;
    if (bVar2 == false) {
      SimpleString::SimpleString(&local_40,"junit");
      bVar2 = operator==((SimpleString *)local_38,&local_40);
      SimpleString::~SimpleString(&local_40);
      OVar3 = OUTPUT_JUNIT;
      if (!bVar2) {
        SimpleString::SimpleString(&local_40,"teamcity");
        bVar2 = operator==((SimpleString *)local_38,&local_40);
        SimpleString::~SimpleString(&local_40);
        OVar3 = OUTPUT_TEAMCITY;
        if (!bVar2) goto LAB_001aaf36;
      }
    }
    this->outputType_ = OVar3;
    bVar2 = true;
  }
  SimpleString::~SimpleString((SimpleString *)local_38);
  return bVar2;
}

Assistant:

bool CommandLineArguments::SetOutputType(int ac, const char** av, int& i)
{
    SimpleString outputType = getParameterField(ac, av, i, "-o");
    if (outputType.size() == 0) return false;

    if (outputType == "normal" || outputType == "eclipse") {
        outputType_ = OUTPUT_ECLIPSE;
        return true;
    }
    if (outputType == "junit") {
        outputType_ = OUTPUT_JUNIT;
        return true;
    }
    if (outputType == "teamcity") {
        outputType_ = OUTPUT_TEAMCITY;
        return true;
    }

    return false;
}